

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int isVowel(char *z)

{
  int iVar1;
  long lVar2;
  
  lVar2 = (long)*z;
  if (lVar2 == 0) {
    return 0;
  }
  if (lVar2 == 0x79) {
    iVar1 = isConsonant(z + 1);
    return iVar1;
  }
  return 1 - (char)(&DAT_001ea15f)[lVar2];
}

Assistant:

static int isVowel(const char *z){
  int j;
  char x = *z;
  if( x==0 ) return 0;
  assert( x>='a' && x<='z' );
  j = cType[x-'a'];
  if( j<2 ) return 1-j;
  return isConsonant(z + 1);
}